

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::GenerateFastStackArgumentsLdElemI(Lowerer *this,Instr *ldElem)

{
  RegOpnd *indexOpnd;
  code *pcVar1;
  bool bVar2;
  IndirOpnd *pIVar3;
  undefined4 *puVar4;
  
  pIVar3 = IR::Opnd::AsIndirOpnd(ldElem->m_src1);
  indexOpnd = pIVar3->m_indexOpnd;
  if (indexOpnd != (RegOpnd *)0x0) {
    bVar2 = IR::Opnd::IsTaggedInt(&indexOpnd->super_Opnd);
    if (bVar2) goto LAB_0057eb64;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x5623,"(indexOpnd && indexOpnd->IsTaggedInt())",
                     "indexOpnd && indexOpnd->IsTaggedInt()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_0057eb64:
  bVar2 = Func::IsInlinee(ldElem->m_func);
  if (bVar2) {
    pIVar3 = GetArgsIndirOpndForInlinee(this,ldElem,&indexOpnd->super_Opnd);
    InsertMove(ldElem->m_dst,&pIVar3->super_Opnd,ldElem,true);
  }
  else {
    GenerateLoadStackArgumentByIndex
              (this,ldElem->m_dst,indexOpnd,ldElem,pIVar3->m_offset + 1,this->m_func);
  }
  IR::Instr::Remove(ldElem);
  return false;
}

Assistant:

bool
Lowerer::GenerateFastStackArgumentsLdElemI(IR::Instr* ldElem)
{
    //  MOV dst, ebp [(valueOpnd + 5) *4]  // 5 for the stack layout
    //

    IR::IndirOpnd *indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
    // Now load the index and check if it is an integer.
    IR::RegOpnd   *indexOpnd = indirOpnd->GetIndexOpnd();
    Assert (indexOpnd && indexOpnd->IsTaggedInt());

    if(ldElem->m_func->IsInlinee())
    {
        IR::IndirOpnd *argIndirOpnd = GetArgsIndirOpndForInlinee(ldElem, indexOpnd);

        Lowerer::InsertMove(ldElem->GetDst(), argIndirOpnd, ldElem);
    }
    else
    {
        GenerateLoadStackArgumentByIndex(ldElem->GetDst(), indexOpnd, ldElem, indirOpnd->GetOffset() + 1, m_func); // +1 to offset 'this'
    }

    ldElem->Remove();
    return false;
}